

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O2

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  uchar uVar1;
  char cVar2;
  char cVar3;
  FT_Memory memory;
  FT_Stream stream_00;
  uchar *__s;
  FT_Library __s2;
  FT_Bitmap_Size *pFVar4;
  FT_ULong count;
  FT_Pos FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  FT_Int FVar8;
  undefined1 auVar9 [8];
  FT_Error FVar10;
  int iVar11;
  FT_String *pFVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  undefined8 *puVar17;
  FT_Face pFVar18;
  int iVar19;
  FT_Face pFVar20;
  FT_Face pFVar21;
  long lVar22;
  undefined1 local_2d0 [8];
  FT_Open_Args args;
  code *local_260;
  code *local_250;
  code *local_248;
  FT_Face local_238;
  FT_ULong FStack_230;
  char local_228;
  FT_Int local_220;
  undefined1 local_218 [32];
  uint local_1f8;
  long local_1f0;
  code *local_1c0;
  uint local_1b8;
  FT_Pos local_1b0 [5];
  FT_GlyphSlot_conflict local_188;
  code *local_158;
  FT_Generic_Finalizer local_150 [3];
  long local_138;
  FT_Size local_128;
  FT_CharMap local_120;
  code *local_f8;
  undefined1 local_f0 [88];
  code *local_98;
  FT_Pointer local_90;
  FT_Parameter *local_88;
  FT_String *local_80;
  FT_Int local_78;
  FT_Int local_74;
  FT_Face local_70;
  FT_Face local_68 [2];
  int local_58;
  FT_Face local_50;
  FT_Face local_48;
  FT_Face local_40;
  FT_Error local_34;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  local_90 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)local_90;
  local_80 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = local_80;
  if (local_80 == (FT_String *)0x0) {
    return 0xb;
  }
  memory = t42face->memory;
  local_88 = params;
  local_78 = face_index;
  local_74 = num_params;
  memset(local_2d0,0,0x240);
  pFVar12 = (FT_String *)ft_mem_alloc(memory,0xc,&local_34);
  t42face[3].style_name = pFVar12;
  FVar10 = local_34;
  if (local_34 == 0) {
    *(undefined8 *)&t42face[3].num_fixed_sizes = 0xc;
    stream_00 = t42face->stream;
    (*(code *)**(undefined8 **)(local_80 + 8))(local_2d0,0,0,memory);
    local_238 = (FT_Face)0x0;
    FStack_230 = 0;
    local_228 = '\0';
    FVar10 = FT_Stream_Seek(stream_00,0);
    local_68[0] = (FT_Face)CONCAT44(local_68[0]._4_4_,FVar10);
    local_40 = t42face;
    if (FVar10 == 0) {
      FVar10 = FT_Stream_EnterFrame(stream_00,0x11);
      local_68[0] = (FT_Face)CONCAT44(local_68[0]._4_4_,FVar10);
      if (FVar10 != 0) goto LAB_0022e9af;
      iVar11 = bcmp(stream_00->cursor,"%!PS-TrueTypeFont",0x11);
      if (iVar11 == 0) {
        FVar10 = 0;
      }
      else {
        local_68[0] = (FT_Face)CONCAT44(local_68[0]._4_4_,2);
        FVar10 = 2;
      }
      FT_Stream_ExitFrame(stream_00);
      if (iVar11 != 0) goto LAB_0022e9af;
      FVar10 = FT_Stream_Seek(stream_00,0);
      local_68[0] = (FT_Face)CONCAT44(local_68[0]._4_4_,FVar10);
      if (FVar10 != 0) goto LAB_0022e9af;
      count = stream_00->size;
      if (stream_00->read != (FT_Stream_IoFunc)0x0) {
        local_238 = (FT_Face)ft_mem_alloc(memory,count,(FT_Error *)local_68);
        FVar10 = (int)local_68[0];
        if ((int)local_68[0] == 0) {
          FVar10 = FT_Stream_Read(stream_00,(FT_Byte *)local_238,count);
          local_68[0] = (FT_Face)CONCAT44(local_68[0]._4_4_,FVar10);
          if (FVar10 == 0) goto LAB_0022f30f;
        }
        goto LAB_0022e9af;
      }
      local_238 = (FT_Face)(stream_00->base + stream_00->pos);
      local_228 = '\x01';
      FVar10 = FT_Stream_Skip(stream_00,count);
      local_68[0] = (FT_Face)CONCAT44(local_68[0]._4_4_,FVar10);
      FStack_230 = count;
      if (FVar10 != 0) goto LAB_0022e9af;
LAB_0022f30f:
      args._0_8_ = local_238;
      FStack_230 = count;
    }
    else {
LAB_0022e9af:
      if (local_228 == '\0') {
        ft_mem_free(memory,local_238);
        local_238 = (FT_Face)0x0;
        FVar10 = (int)local_68[0];
      }
      t42face = local_40;
      if (FVar10 != 0) goto LAB_0022ec7a;
    }
    local_34 = 0;
    local_2d0 = (undefined1  [8])local_238;
    pFVar18 = (FT_Face)((long)&local_238->num_faces + FStack_230);
    args.memory_size._0_4_ = 0;
    args.memory_base = (FT_Byte *)pFVar18;
    (*(code *)args._48_8_)(local_2d0);
    local_50 = (FT_Face)&local_40[2].extensions;
    local_48 = (FT_Face)&local_40[1].num_fixed_sizes;
    local_70 = local_40 + 1;
    while ((ulong)local_2d0 < pFVar18) {
      uVar1 = (uchar)*(FT_Long *)local_2d0;
      if ((uVar1 == 'F') && ((FT_Face)((long)((long)local_2d0 + 0x18) + 1U) < pFVar18)) {
        iVar11 = strncmp((char *)local_2d0,"FontDirectory",0xd);
        if (iVar11 == 0) {
          (*(code *)args.params)(local_2d0);
          (*(code *)args._48_8_)(local_2d0);
          auVar9 = local_2d0;
          while ((ulong)local_2d0 < pFVar18) {
            if ((((uchar)*(FT_Long *)local_2d0 == 'k') &&
                ((FT_Face)((long)(FT_Long *)local_2d0 + 5U) < pFVar18)) &&
               (iVar11 = strncmp((char *)local_2d0,"known",5), iVar11 == 0)) {
              (*(code *)args.params)(local_2d0);
              (*local_260)(local_2d0,local_68);
              if (local_58 == 3) {
                auVar9 = local_2d0;
              }
              break;
            }
            (*(code *)args.params)(local_2d0);
            t42face = local_40;
            FVar10 = (int)args.memory_size;
            if ((int)args.memory_size != 0) goto LAB_0022ec7a;
            (*(code *)args._48_8_)(local_2d0);
          }
        }
        else {
LAB_0022eb8e:
          (*(code *)args.params)(local_2d0);
LAB_0022eb9d:
          t42face = local_40;
          auVar9 = local_2d0;
          FVar10 = (int)args.memory_size;
          if ((int)args.memory_size != 0) goto LAB_0022ec7a;
        }
      }
      else {
        if ((uVar1 != '/') || (pFVar18 <= (FT_Face)((long)(FT_Long *)local_2d0 + 2U)))
        goto LAB_0022eb8e;
        pFVar20 = (FT_Face)((long)(FT_Long *)local_2d0 + 1);
        local_2d0 = (undefined1  [8])pFVar20;
        (*(code *)args.params)(local_2d0);
        t42face = local_40;
        FVar10 = (int)args.memory_size;
        if ((int)args.memory_size != 0) goto LAB_0022ec7a;
        auVar9 = local_2d0;
        if (((int)((long)local_2d0 - (long)pFVar20) - 1U < 0x15) && ((ulong)local_2d0 < pFVar18)) {
          uVar16 = (long)local_2d0 - (long)pFVar20 & 0xffffffff;
          for (lVar22 = 0; auVar9 = local_2d0, lVar22 != 0x3c0; lVar22 = lVar22 + 0x30) {
            __s = *(uchar **)((long)&t42_keywords[0].ident + lVar22);
            if ((((__s != (uchar *)0x0) && ((uchar)pFVar20->num_faces == *__s)) &&
                (sVar13 = strlen((char *)__s), uVar16 == sVar13)) &&
               (iVar11 = bcmp(pFVar20,__s,uVar16), iVar11 == 0)) {
              iVar11 = *(int *)((long)&t42_keywords[0].type + lVar22);
              if (iVar11 == 0xb) {
                (**(code **)((long)&t42_keywords[0].reader + lVar22))(local_40,local_2d0);
              }
              else {
                iVar19 = *(int *)((long)&t42_keywords[0].location + lVar22);
                local_68[0] = local_48;
                if ((iVar19 != 2) && (local_68[0] = local_50, iVar19 != 5)) {
                  local_68[0] = local_70;
                }
                if (iVar11 - 9U < 2) {
                  args.memory_size._0_4_ = (*local_248)();
                }
                else {
                  args.memory_size._0_4_ =
                       (*local_250)(local_2d0,(long)&t42_keywords[0].ident + lVar22,local_68,0,0);
                }
              }
              goto LAB_0022eb9d;
            }
          }
        }
      }
      local_2d0 = auVar9;
      (*(code *)args._48_8_)(local_2d0);
    }
    local_34 = (int)args.memory_size;
    t42face = local_40;
    FVar10 = local_34;
    if ((int)args.memory_size == 0) {
      if (*(char *)((long)&local_40[2].driver + 1) == '*') {
        local_40[2].max_advance_width = (undefined2)local_1b8;
        local_40[2].max_advance_height = local_1b8._2_2_;
        if (local_138 == 0) {
          local_34 = 3;
        }
        local_138 = 0;
        local_40[2].generic.finalizer = local_150[0];
        local_40[2].size = local_128;
        local_40[2].charmap = local_120;
        local_40[2].bbox.xMin = local_1b0[0];
        local_40[2].glyph = local_188;
        local_1b0[0] = 0;
        local_188 = (FT_GlyphSlot_conflict)0x0;
        FVar10 = local_34;
        if (*(int *)&local_40[2].style_name == 1) {
          pFVar20 = (FT_Face)0x0;
          pFVar18 = (FT_Face)(ulong)local_1b8;
          if ((int)local_1b8 < 1) {
            pFVar18 = pFVar20;
          }
          local_70 = (FT_Face)(ulong)local_1f8;
          if ((int)local_1f8 < 1) {
            local_70 = pFVar20;
          }
          local_50 = (FT_Face)((ulong)local_50 & 0xffffffff00000000);
          local_48 = (FT_Face)((ulong)local_48 & 0xffffffff00000000);
          for (; pFVar20 != local_70; pFVar20 = (FT_Face)((long)&pFVar20->num_faces + 1)) {
            *(undefined2 *)(*(long *)&local_40[2].num_charmaps + (long)pFVar20 * 2) = 0;
            local_40[2].charmaps[(long)pFVar20] = (FT_CharMap)".notdef";
            pcVar14 = *(char **)(local_1f0 + (long)pFVar20 * 8);
            if (pcVar14 != (char *)0x0) {
              for (pFVar21 = (FT_Face)0x0; pFVar18 != pFVar21;
                  pFVar21 = (FT_Face)((long)&pFVar21->num_faces + 1)) {
                __s2 = (&(local_40[2].glyph)->library)[(long)pFVar21];
                iVar11 = strcmp(pcVar14,(char *)__s2);
                if (iVar11 == 0) {
                  *(short *)(*(long *)&local_40[2].num_charmaps + (long)pFVar20 * 2) =
                       (short)pFVar21;
                  local_40[2].charmaps[(long)pFVar20] = (FT_CharMap)__s2;
                  iVar11 = strcmp(".notdef",(char *)__s2);
                  if (iVar11 != 0) {
                    iVar19 = (int)pFVar20;
                    iVar11 = (int)local_50;
                    if (iVar19 < (int)local_50) {
                      iVar11 = iVar19;
                    }
                    local_50 = (FT_Face)CONCAT44(local_50._4_4_,iVar11);
                    iVar11 = (int)local_48;
                    if ((long)(int)local_48 <= (long)pFVar20) {
                      iVar11 = iVar19 + 1;
                    }
                    local_48 = (FT_Face)CONCAT44(local_48._4_4_,iVar11);
                  }
                  break;
                }
              }
            }
          }
          *(int *)&local_40[2].field_0x3c = (int)local_50;
          *(int *)&local_40[2].available_sizes = (int)local_48;
          local_40[2].num_fixed_sizes = local_220;
          t42face = local_40;
          FVar10 = local_34;
        }
      }
      else {
        local_34 = 2;
        FVar10 = local_34;
      }
    }
  }
LAB_0022ec7a:
  local_34 = FVar10;
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(local_218);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(local_150);
  }
  FVar8 = local_78;
  if (local_158 != (code *)0x0) {
    (*local_158)(local_1b0);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(local_f0);
  }
  if (local_228 == '\0') {
    ft_mem_free((FT_Memory)args.pathname,local_238);
  }
  (*(code *)CONCAT44(args.driver._4_4_,(int)args.driver))();
  if (FVar8 < 0 || local_34 != 0) {
    return local_34;
  }
  if ((short)FVar8 != 0) {
    return 6;
  }
  iVar11._0_2_ = t42face[2].max_advance_width;
  iVar11._2_2_ = t42face[2].max_advance_height;
  t42face->num_glyphs = (long)iVar11;
  t42face->num_charmaps = 0;
  t42face->face_index = 0;
  t42face->face_flags =
       (ulong)(*(char *)&t42face[1].style_name != '\0') << 2 | t42face->face_flags | 0xa11;
  pcVar14 = (char *)t42face[1].style_flags;
  t42face->family_name = pcVar14;
  t42face->style_name = "Regular";
  if (pcVar14 == (char *)0x0) {
    if (t42face[2].family_name != (FT_String *)0x0) {
      t42face->family_name = t42face[2].family_name;
    }
  }
  else {
    pcVar15 = (char *)t42face[1].face_flags;
    if (pcVar15 != (char *)0x0) {
      do {
        cVar2 = *pcVar15;
        while( true ) {
          if (cVar2 == '\0') goto LAB_0022efb3;
          cVar3 = *pcVar14;
          if (cVar2 == cVar3) break;
          if ((cVar2 == ' ') || (cVar2 == '-')) goto LAB_0022edbb;
          if ((cVar3 != ' ') && (cVar3 != '-')) {
            if (cVar3 == '\0') {
              t42face->style_name = pcVar15;
            }
            goto LAB_0022efb3;
          }
          pcVar14 = pcVar14 + 1;
        }
        pcVar14 = pcVar14 + 1;
LAB_0022edbb:
        pcVar15 = pcVar15 + 1;
      } while( true );
    }
  }
LAB_0022efb3:
  t42face->num_fixed_sizes = 0;
  t42face->available_sizes = (FT_Bitmap_Size *)0x0;
  local_2d0._0_4_ = 9;
  args.stream = (FT_Stream)FT_Get_Module((t42face->driver->root).library,"truetype");
  args._0_8_ = t42face[3].style_name;
  args.memory_base = *(FT_Byte **)&t42face[3].num_fixed_sizes;
  if (local_74 != 0) {
    local_2d0._0_4_ = 0x19;
    args.driver._0_4_ = local_74;
    args._48_8_ = local_88;
  }
  FVar10 = FT_Open_Face((t42face->driver->root).library,(FT_Open_Args *)local_2d0,0,
                        (FT_Face_conflict *)&t42face[3].available_sizes);
  if (FVar10 != 0) {
    return FVar10;
  }
  FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
  pFVar4 = t42face[3].available_sizes;
  FVar5 = pFVar4[3].x_ppem;
  FVar6 = pFVar4[3].y_ppem;
  FVar7 = *(FT_Pos *)(pFVar4 + 4);
  (t42face->bbox).xMin = pFVar4[3].size;
  (t42face->bbox).yMin = FVar5;
  (t42face->bbox).xMax = FVar6;
  (t42face->bbox).yMax = FVar7;
  t42face->units_per_EM = (FT_UShort)pFVar4[4].size;
  t42face->ascender = *(FT_Short *)((long)&pFVar4[4].size + 2);
  t42face->descender = *(FT_Short *)((long)&pFVar4[4].size + 4);
  t42face->height = *(FT_Short *)((long)&pFVar4[4].size + 6);
  t42face->max_advance_width = (FT_Short)pFVar4[4].x_ppem;
  t42face->max_advance_height = *(FT_Short *)((long)&pFVar4[4].x_ppem + 2);
  t42face->underline_position = *(FT_Short *)((long)&t42face[1].style_name + 2);
  t42face->underline_thickness = *(FT_Short *)((long)&t42face[1].style_name + 4);
  uVar16 = (ulong)(t42face[1].family_name != (FT_String *)0x0);
  t42face->style_flags = uVar16;
  if ((pFVar4->y_ppem & 2) != 0) {
    t42face->style_flags = uVar16 | 2;
  }
  if ((pFVar4->x_ppem & 0x20) != 0) {
    *(byte *)&t42face->face_flags = (byte)t42face->face_flags | 0x20;
  }
  if (local_90 == (FT_Pointer)0x0) {
switchD_0022f18c_default:
    FVar10 = 0;
  }
  else {
    puVar17 = *(undefined8 **)(local_80 + 0x40);
    args.flags = 0x756e6963;
    args._4_4_ = 0x10003;
    local_2d0 = (undefined1  [8])t42face;
    FVar10 = FT_CMap_New((FT_CMap_Class)puVar17[3],(FT_Pointer)0x0,(FT_CharMap)local_2d0,
                         (FT_CMap_conflict *)0x0);
    if (FVar10 != 0 && (char)FVar10 != -0x5d) {
      return FVar10;
    }
    switch(*(undefined4 *)&t42face[2].style_name) {
    case 1:
      args.flags = 0x41444243;
      args._4_4_ = 0x20007;
      puVar17 = puVar17 + 2;
      break;
    case 2:
      args.flags = 0x41444f42;
      args._4_4_ = 7;
      break;
    case 3:
      puVar17 = puVar17 + 3;
      args.flags = 0x6c617431;
      args._4_4_ = 0x30007;
      break;
    case 4:
      args.flags = 0x41444245;
      args._4_4_ = 0x10007;
      puVar17 = puVar17 + 1;
      break;
    default:
      goto switchD_0022f18c_default;
    }
    FVar10 = 0;
    if ((FT_CMap_Class)*puVar17 != (FT_CMap_Class)0x0) {
      FVar10 = FT_CMap_New((FT_CMap_Class)*puVar17,(FT_Pointer)0x0,(FT_CharMap)local_2d0,
                           (FT_CMap_conflict *)0x0);
    }
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }